

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::ReturnAction<ot::commissioner::EnergyReport_*>::
Impl<ot::commissioner::EnergyReport_*,_const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
::Impl(Impl<ot::commissioner::EnergyReport_*,_const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
       *this,shared_ptr<ot::commissioner::EnergyReport_*> *value)

{
  element_type *ppEVar1;
  EnergyReport *pEVar2;
  shared_ptr<ot::commissioner::EnergyReport_*> *value_local;
  Impl<ot::commissioner::EnergyReport_*,_const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
  *this_local;
  
  ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
  ActionInterface(&this->
                   super_ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                 );
  (this->
  super_ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>).
  _vptr_ActionInterface = (_func_int **)&PTR__Impl_005c1b80;
  ppEVar1 = std::
            __shared_ptr_access<ot::commissioner::EnergyReport_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<ot::commissioner::EnergyReport_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)value);
  this->value_before_cast_ = *ppEVar1;
  pEVar2 = ImplicitCast_<ot::commissioner::EnergyReport_const*>(this->value_before_cast_);
  this->value_ = pEVar2;
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}